

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::
     PrintSmartPointer<pstore::dump::value,std::shared_ptr<pstore::dump::value>,void>
               (shared_ptr<pstore::dump::value> *ptr,ostream *os,int param_3)

{
  element_type *peVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  
  if ((ptr->super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    pcVar4 = "(nullptr)";
    lVar3 = 9;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os,"(ptr = ",7);
    poVar2 = std::ostream::_M_insert<void_const*>(os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", value = ",10);
    peVar1 = (ptr->super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*peVar1->_vptr_value[0x13])(peVar1,os);
    pcVar4 = ")";
    lVar3 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,lVar3);
  return;
}

Assistant:

void PrintSmartPointer(const Ptr& ptr, std::ostream* os, int) {
  if (ptr == nullptr) {
    *os << "(nullptr)";
  } else {
    *os << "(ptr = " << (VoidifyPointer)(ptr.get()) << ", value = ";
    UniversalPrinter<T>::Print(*ptr, os);
    *os << ")";
  }
}